

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O0

void __thiscall
FxIfStatement::FxIfStatement
          (FxIfStatement *this,FxExpression *cond,FxExpression *true_part,FxExpression *false_part,
          FScriptPosition *pos)

{
  FScriptPosition *pos_local;
  FxExpression *false_part_local;
  FxExpression *true_part_local;
  FxExpression *cond_local;
  FxIfStatement *this_local;
  
  FxExpression::FxExpression(&this->super_FxExpression,EFX_IfStatement,pos);
  (this->super_FxExpression)._vptr_FxExpression = (_func_int **)&PTR__FxIfStatement_00a0b4f0;
  this->Condition = cond;
  this->WhenTrue = true_part;
  this->WhenFalse = false_part;
  if (this->WhenTrue != (FxExpression *)0x0) {
    this->WhenTrue->NeedResult = false;
  }
  if (this->WhenFalse != (FxExpression *)0x0) {
    this->WhenFalse->NeedResult = false;
  }
  if (cond != (FxExpression *)0x0) {
    return;
  }
  __assert_fail("cond != nullptr",
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/scripting/codegeneration/codegen.cpp"
                ,0x22be,
                "FxIfStatement::FxIfStatement(FxExpression *, FxExpression *, FxExpression *, const FScriptPosition &)"
               );
}

Assistant:

FxIfStatement::FxIfStatement(FxExpression *cond, FxExpression *true_part,
	FxExpression *false_part, const FScriptPosition &pos)
: FxExpression(EFX_IfStatement, pos)
{
	Condition = cond;
	WhenTrue = true_part;
	WhenFalse = false_part;
	if (WhenTrue != nullptr) WhenTrue->NeedResult = false;
	if (WhenFalse != nullptr) WhenFalse->NeedResult = false;
	assert(cond != nullptr);
}